

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cc
# Opt level: O2

event * helix::make_ob_event
                  (event *__return_storage_ptr__,string *symbol,uint64_t timestamp,order_book *ob,
                  event_mask mask)

{
  __return_storage_ptr__->_mask = mask | 1;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->_symbol,(string *)symbol);
  __return_storage_ptr__->_timestamp = timestamp;
  __return_storage_ptr__->_ob = ob;
  __return_storage_ptr__->_trade = (trade *)0x0;
  return __return_storage_ptr__;
}

Assistant:

event make_ob_event(const std::string& symbol, uint64_t timestamp, order_book* ob, event_mask mask)
{
    return event{mask | ev_order_book_update, symbol, timestamp, ob, nullptr};
}